

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdUnop<unsigned_short,unsigned_short>
          (Thread *this,UnopFunc<unsigned_short,_unsigned_short> *f)

{
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  SR result;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  
  local_38.v128_.v = (v128)Pop(this);
  std::transform<unsigned_short*,unsigned_short*,unsigned_short(*)(unsigned_short)>
            ((unsigned_short *)&local_38.i32_,(unsigned_short *)&local_28.i32_,
             (unsigned_short *)&local_28.i32_,f);
  Push(this,(Value)local_28);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdUnop(UnopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  auto val = Pop<ST>();
  SR result;
  std::transform(std::begin(val.v), std::end(val.v), std::begin(result.v), f);
  Push(result);
  return RunResult::Ok;
}